

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall kratos::InsertSyncReset::visit(InsertSyncReset *this,Generator *generator)

{
  Port *this_00;
  bool bVar1;
  PortType PVar2;
  StatementType SVar3;
  StatementBlockType SVar4;
  int iVar5;
  VarType VVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *this_01;
  element_type *this_02;
  element_type *block;
  __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *peVar8;
  element_type *peVar9;
  undefined4 extraout_var;
  size_type sVar10;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_04;
  element_type *this_05;
  Var **ppVVar11;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_118;
  Var *local_110;
  Var *right;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sources;
  shared_ptr<kratos::Port> child_port;
  shared_ptr<kratos::Generator> *child;
  __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
  local_b0;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range2;
  shared_ptr<kratos::SequentialStmtBlock> seq;
  undefined1 local_60 [8];
  shared_ptr<kratos::StmtBlock> blk;
  shared_ptr<kratos::Stmt> stmt;
  uint64_t i;
  uint64_t stmts_count;
  undefined8 local_20;
  Port *port;
  Generator *generator_local;
  InsertSyncReset *this_local;
  
  port = (Port *)generator;
  generator_local = (Generator *)this;
  bVar1 = Generator::external(generator);
  if (((!bVar1) && (bVar1 = Generator::is_stub((Generator *)port), !bVar1)) &&
     ((this->run_pass_ & 1U) != 0)) {
    bVar1 = Generator::has_port((Generator *)port,&this->reset_name_);
    if (bVar1) {
      Generator::get_port((Generator *)&stmts_count,(string *)port);
      local_20 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&stmts_count);
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&stmts_count);
      PVar2 = Port::port_type((Port *)local_20);
      if (PVar2 != Reset) {
        (**(code **)(*(long *)local_20 + 0x158))(local_20,3);
      }
    }
    else {
      local_20 = Generator::port((Generator *)port,In,&this->reset_name_,1,Reset);
    }
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             Generator::stmts_count((Generator *)port);
    for (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < p_Var7
        ; stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
      Generator::get_stmt((Generator *)
                          &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(uint32_t)port);
      this_01 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
      SVar3 = Stmt::type(this_01);
      if (SVar3 == Block) {
        std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        Stmt::as<kratos::StmtBlock>((Stmt *)local_60);
        this_02 = std::
                  __shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_60);
        SVar4 = StmtBlock::block_type(this_02);
        if (SVar4 == Sequential) {
          std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_60);
          Stmt::as<kratos::SequentialStmtBlock>((Stmt *)&__range2);
          block = std::__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              *)&__range2);
          inject_reset_logic(this,block,(Port *)local_20);
          std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
                    ((shared_ptr<kratos::SequentialStmtBlock> *)&__range2);
        }
        std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_60);
      }
      std::shared_ptr<kratos::Stmt>::~shared_ptr
                ((shared_ptr<kratos::Stmt> *)
                 &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    Generator::get_child_generators
              ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)&__begin2,(Generator *)port);
    __end2 = std::
             vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
             ::begin((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      *)&__begin2);
    local_b0._M_current =
         (shared_ptr<kratos::Generator> *)
         std::
         vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
         ::end((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_b0), bVar1) {
      this_03 = (__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                ::operator*(&__end2);
      peVar8 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_03);
      bVar1 = Generator::has_port(peVar8,&this->reset_name_);
      if (bVar1) {
        peVar8 = std::
                 __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_03);
        Generator::get_port((Generator *)&sources._M_h._M_single_bucket,(string *)peVar8);
        peVar9 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&sources._M_h._M_single_bucket);
        iVar5 = (*(peVar9->super_Var).super_IRNode._vptr_IRNode[0x10])();
        std::
        unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
        ::unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                         *)&right,
                        (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                         *)CONCAT44(extraout_var,iVar5));
        sVar10 = std::
                 unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                         *)&right);
        if (sVar10 < 2) {
          sVar10 = std::
                   unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                           *)&right);
          if (sVar10 == 1) {
            local_118._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                          *)&right);
            this_04 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::__detail::
                         _Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                                   ((_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
                                     *)&local_118);
            this_05 = std::
                      __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(this_04);
            ppVVar11 = AssignStmt::right(this_05);
            local_110 = *ppVVar11;
            VVar6 = Var::type(local_110);
            if (VVar6 == ConstValue) {
              peVar9 = std::
                       __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&sources._M_h._M_single_bucket);
              (*(peVar9->super_Var).super_IRNode._vptr_IRNode[0x12])(peVar9,1);
            }
          }
          this_00 = port;
          peVar9 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&sources._M_h._M_single_bucket);
          Generator::wire((Generator *)this_00,&peVar9->super_Var,(Var *)local_20);
        }
        std::
        unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
        ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                          *)&right);
        std::shared_ptr<kratos::Port>::~shared_ptr
                  ((shared_ptr<kratos::Port> *)&sources._M_h._M_single_bucket);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               *)&__begin2);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator->external() || generator->is_stub()) return;
        if (!run_pass_) return;
        Port* port;
        if (generator->has_port(reset_name_)) {
            port = generator->get_port(reset_name_).get();
            if (port->port_type() != PortType::Reset) {
                port->set_port_type(PortType::Reset);
            }
        } else {
            // create a synchronous reset port
            port = &generator->port(PortDirection::In, reset_name_, 1, PortType::Reset);
        }
        // look through each sequential block
        auto stmts_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmts_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto blk = stmt->as<StmtBlock>();
                if (blk->block_type() == StatementBlockType::Sequential) {
                    auto seq = blk->as<SequentialStmtBlock>();
                    inject_reset_logic(seq.get(), port);
                }
            }
        }

        // wire the children. we do in this order since this pass is run in parallel from bottom
        // up
        for (auto const& child : generator->get_child_generators()) {
            if (child->has_port(reset_name_)) {
                auto child_port = child->get_port(reset_name_);
                auto sources = child_port->sources();
                if (sources.size() > 1) continue;
                if (sources.size() == 1) {
                    auto* right = (*sources.begin())->right();
                    if (right->type() == VarType::ConstValue) {
                        child_port->clear_sources(true);
                    }
                }
                generator->wire(*child_port, *port);
            }
        }
    }